

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O3

void __thiscall
Imf_3_2::Image::resize
          (Image *this,Box2i *dataWindow,LevelMode levelMode,LevelRoundingMode levelRoundingMode)

{
  ImageLevel **ppIVar1;
  ImageLevel *pIVar2;
  int iVar3;
  ulong uVar4;
  ImageLevel **ppIVar5;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  Box2i levelDataWindow;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  clearLevels(this);
  if (levelMode == ONE_LEVEL) {
    iVar3 = 1;
    iVar8 = 1;
  }
  else if (levelMode == RIPMAP_LEVELS) {
    iVar3 = anon_unknown_8::roundLog2
                      (((dataWindow->max).x - (dataWindow->min).x) + 1,levelRoundingMode);
    iVar3 = iVar3 + 1;
    iVar8 = anon_unknown_8::roundLog2
                      (((dataWindow->max).y - (dataWindow->min).y) + 1,levelRoundingMode);
    iVar8 = iVar8 + 1;
  }
  else if (levelMode == MIPMAP_LEVELS) {
    iVar3 = ((dataWindow->max).x - (dataWindow->min).x) + 1;
    iVar8 = ((dataWindow->max).y - (dataWindow->min).y) + 1;
    if (iVar8 < iVar3) {
      iVar8 = iVar3;
    }
    iVar3 = anon_unknown_8::roundLog2(iVar8,levelRoundingMode);
    iVar3 = iVar3 + 1;
    iVar8 = iVar3;
  }
  else {
    iVar3 = 0;
    iVar8 = 0;
  }
  uVar4 = (ulong)iVar8;
  uVar7 = (ulong)iVar3;
  ppIVar5 = (ImageLevel **)operator_new__(-(ulong)(uVar4 * uVar7 >> 0x3d != 0) | uVar4 * uVar7 * 8);
  ppIVar1 = (this->_levels)._data;
  if (ppIVar1 != (ImageLevel **)0x0) {
    operator_delete__(ppIVar1);
  }
  (this->_levels)._sizeX = uVar4;
  (this->_levels)._sizeY = uVar7;
  (this->_levels)._data = ppIVar5;
  if (0 < iVar8) {
    uVar11 = 0;
    do {
      if (0 < iVar3) {
        uVar10 = 0;
        do {
          if (uVar10 == uVar11 || levelMode != MIPMAP_LEVELS) {
            local_40 = (dataWindow->min).x;
            iVar8 = (dataWindow->max).x;
            local_34 = -1;
            local_38 = -1;
            iVar9 = iVar8 - local_40;
            if (local_40 <= iVar8) {
              local_38 = (iVar9 + 1) / (1 << ((byte)uVar10 & 0x1f));
              local_38 = (uint)(local_38 << ((byte)uVar10 & 0x1f) <= iVar9 &&
                               levelRoundingMode == ROUND_UP) + local_38;
              if (local_38 < 2) {
                local_38 = 1;
              }
              local_38 = local_38 + -1;
            }
            local_3c = (dataWindow->min).y;
            iVar8 = (dataWindow->max).y;
            iVar9 = iVar8 - local_3c;
            if (local_3c <= iVar8) {
              local_34 = (iVar9 + 1) / (1 << ((byte)uVar11 & 0x1f));
              local_34 = (uint)(local_34 << ((byte)uVar11 & 0x1f) <= iVar9 &&
                               levelRoundingMode == ROUND_UP) + local_34;
              if (local_34 < 2) {
                local_34 = 1;
              }
              local_34 = local_34 + -1;
            }
            local_38 = local_38 + local_40;
            local_34 = local_34 + local_3c;
            iVar8 = (*this->_vptr_Image[7])(this,uVar10 & 0xffffffff,uVar11 & 0xffffffff,&local_40);
            (this->_levels)._data[(this->_levels)._sizeY * uVar11 + uVar10] =
                 (ImageLevel *)CONCAT44(extraout_var,iVar8);
            for (p_Var6 = (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var6 != &(this->_channels)._M_t._M_impl.super__Rb_tree_header;
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
              pIVar2 = (this->_levels)._data[(this->_levels)._sizeY * uVar11 + uVar10];
              (*pIVar2->_vptr_ImageLevel[4])
                        (pIVar2,p_Var6 + 1,(ulong)p_Var6[2]._M_color,
                         (ulong)*(uint *)&p_Var6[2].field_0x4,(ulong)*(uint *)&p_Var6[2]._M_parent,
                         (ulong)*(byte *)((long)&p_Var6[2]._M_parent + 4));
            }
          }
          else {
            (this->_levels)._data[(this->_levels)._sizeY * uVar11 + uVar10] = (ImageLevel *)0x0;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar7);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar4);
  }
  (this->_dataWindow).min = dataWindow->min;
  (this->_dataWindow).max = dataWindow->max;
  this->_levelMode = levelMode;
  this->_levelRoundingMode = levelRoundingMode;
  return;
}

Assistant:

void
Image::resize (
    const Box2i&      dataWindow,
    LevelMode         levelMode,
    LevelRoundingMode levelRoundingMode)
{
    try
    {
        clearLevels ();

        int nx = computeNumXLevels (dataWindow, levelMode, levelRoundingMode);
        int ny = computeNumYLevels (dataWindow, levelMode, levelRoundingMode);

        _levels.resizeErase (ny, nx);

        for (int y = 0; y < ny; ++y)
        {
            for (int x = 0; x < nx; ++x)
            {
                if (levelMode == MIPMAP_LEVELS && x != y)
                {
                    _levels[y][x] = 0;
                    continue;
                }

                Box2i levelDataWindow = computeDataWindowForLevel (
                    dataWindow, x, y, levelRoundingMode);

                _levels[y][x] = newLevel (x, y, levelDataWindow);

                for (ChannelMap::iterator i = _channels.begin ();
                     i != _channels.end ();
                     ++i)
                {
                    _levels[y][x]->insertChannel (
                        i->first,
                        i->second.type,
                        i->second.xSampling,
                        i->second.ySampling,
                        i->second.pLinear);
                }
            }
        }

        _dataWindow        = dataWindow;
        _levelMode         = levelMode;
        _levelRoundingMode = levelRoundingMode;
    }
    catch (...)
    {
        clearLevels ();
        throw;
    }
}